

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qstackedwidget.cpp
# Opt level: O0

int __thiscall QStackedWidget::qt_metacall(QStackedWidget *this,Call _c,int _id,void **_a)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  void **in_stack_00000030;
  int in_stack_00000038;
  Call in_stack_0000003c;
  QObject *in_stack_00000040;
  undefined4 local_4;
  
  local_4 = QFrame::qt_metacall((QFrame *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                                (int)in_RCX,in_RDI);
  if (-1 < local_4) {
    if (in_ESI == 0) {
      if (local_4 < 5) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_4 = local_4 + -5;
    }
    if (in_ESI == 7) {
      if (local_4 < 5) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_4 = local_4 + -5;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      local_4 = local_4 + -2;
    }
  }
  return local_4;
}

Assistant:

int QStackedWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}